

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

void __thiscall
cmDependsFortran::ConsiderModule(cmDependsFortran *this,string *name,string *stampDir)

{
  bool bVar1;
  pointer pcVar2;
  pointer ppVar3;
  byte local_65;
  char local_51;
  undefined1 local_50 [8];
  string stampFile;
  _Self local_28;
  iterator required;
  string *stampDir_local;
  string *name_local;
  cmDependsFortran *this_local;
  
  required._M_node = (_Base_ptr)stampDir;
  pcVar2 = std::
           unique_ptr<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>::
           operator->(&this->Internal);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&pcVar2->TargetRequires,name);
  pcVar2 = std::
           unique_ptr<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>::
           operator->(&this->Internal);
  stampFile.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&pcVar2->TargetRequires);
  bVar1 = std::operator!=(&local_28,(_Self *)((long)&stampFile.field_2 + 8));
  local_65 = 0;
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_28);
    local_65 = std::__cxx11::string::empty();
  }
  if ((local_65 & 1) != 0) {
    local_51 = '/';
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[7]>
              ((string *)local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)required._M_node
               ,&local_51,name,(char (*) [7])".stamp");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    std::__cxx11::string::operator=((string *)&ppVar3->second,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void cmDependsFortran::ConsiderModule(const std::string& name,
                                      const std::string& stampDir)
{
  // Locate each required module.
  auto required = this->Internal->TargetRequires.find(name);
  if (required != this->Internal->TargetRequires.end() &&
      required->second.empty()) {
    // The module is provided by a CMake target.  It will have a stamp file.
    std::string stampFile = cmStrCat(stampDir, '/', name, ".stamp");
    required->second = stampFile;
  }
}